

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_json_file_from_disk.unit.cpp
# Opt level: O1

void __thiscall
TestLoadJSONFromDisk_TestMissingJSONFile_Test::TestBody
          (TestLoadJSONFromDisk_TestMissingJSONFile_Test *this)

{
  bool bVar1;
  ScopedTrace gtest_trace_128;
  TrueWithString gtest_msg;
  path clear_3_path;
  ScopedTrace local_9e1;
  string local_9e0;
  AssertHelper local_9c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9b8;
  path local_990;
  ProductData local_968;
  
  testing::ScopedTrace::ScopedTrace
            (&local_9e1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
             ,0x80,"Begin Test: Load missing file from disk.");
  std::filesystem::__cxx11::path::path<char[96],std::filesystem::__cxx11::path>
            (&local_990,
             (char (*) [96])
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test"
             ,auto_format);
  std::filesystem::__cxx11::path::_M_append(&local_990,0x11,"some_invalid_path");
  std::filesystem::__cxx11::path::_M_append(&local_990,0x15,"igsdb_v1_clear_3.json");
  local_9b8.field_2._8_8_ = 0;
  local_9b8._M_string_length = 0;
  local_9b8.field_2._M_allocated_capacity = 0;
  local_9b8._M_dataplus._M_p = (pointer)&local_9b8.field_2;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    local_9e0._M_dataplus._M_p = (pointer)&local_9e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_9e0,local_990._M_pathname._M_dataplus._M_p,
               local_990._M_pathname._M_dataplus._M_p + local_990._M_pathname._M_string_length);
    OpticsParser::parseJSONFile(&local_968,&local_9e0);
    OpticsParser::ProductData::~ProductData(&local_968);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_9e0._M_dataplus._M_p != &local_9e0.field_2) {
      operator_delete(local_9e0._M_dataplus._M_p,local_9e0.field_2._M_allocated_capacity + 1);
    }
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
            (&local_9b8,0,local_9b8._M_string_length,
             "Expected: OpticsParser::parseJSONFile(clear_3_path.string()) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
             ,0x89);
  testing::Message::Message((Message *)&local_9e0);
  testing::internal::AssertHelper::AssertHelper
            (&local_9c0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/LBNL-ETA[P]OpticalMeasurementParser/test/read_json_file_from_disk.unit.cpp"
             ,0x86,local_9b8._M_dataplus._M_p);
  testing::internal::AssertHelper::operator=(&local_9c0,(Message *)&local_9e0);
  testing::internal::AssertHelper::~AssertHelper(&local_9c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9e0._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    (**(code **)(*(size_type *)local_9e0._M_dataplus._M_p + 8))();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9b8._M_dataplus._M_p != &local_9b8.field_2) {
    operator_delete(local_9b8._M_dataplus._M_p,local_9b8.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::~path(&local_990);
  testing::ScopedTrace::~ScopedTrace(&local_9e1);
  return;
}

Assistant:

TEST(TestLoadJSONFromDisk, TestMissingJSONFile)
{
    SCOPED_TRACE("Begin Test: Load missing file from disk.");

    std::filesystem::path clear_3_path(TEST_DATA_DIR);
    clear_3_path /= "some_invalid_path";
    clear_3_path /= "igsdb_v1_clear_3.json";

    EXPECT_THROW(OpticsParser::parseJSONFile(clear_3_path.string()), std::runtime_error);
}